

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O3

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  long lVar1;
  Arg *pAVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  pointer ppAVar10;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  XorHandler xorHandler;
  string message;
  string local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_a0;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> local_88;
  ulong local_70;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_68;
  string local_50;
  
  iVar5 = (*_cmd->_vptr_CmdLineInterface[0xb])(_cmd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (&local_88,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar5));
  iVar5 = (*_cmd->_vptr_CmdLineInterface[0xe])(_cmd);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,((long *)CONCAT44(extraout_var_00,iVar5))[1] + lVar1);
  iVar5 = (*_cmd->_vptr_CmdLineInterface[0xc])(_cmd);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_68,
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)CONCAT44(extraout_var_01,iVar5));
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_a0,&local_68);
  cVar4 = (char)os;
  if (local_a0.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a0.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      ppAVar10 = local_a0.
                 super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_70 = uVar9;
      while (ppAVar10 !=
             local_a0.
             super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar9].
             super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        pAVar2 = *ppAVar10;
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"val","");
        (*pAVar2->_vptr_Arg[9])(&local_e0,pAVar2,(string *)local_c0);
        spacePrint(this,os,&local_e0,0x4b,3,3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0]);
        }
        Arg::getDescription_abi_cxx11_(&local_e0,*ppAVar10);
        spacePrint(this,os,&local_e0,0x4b,5,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        ppAVar10 = ppAVar10 + 1;
        if (ppAVar10 ==
            local_a0.
            super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar9].
            super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"-- OR --","");
        spacePrint(this,os,&local_e0,0x4b,9,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
      std::ostream::put(cVar4);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      uVar9 = local_70 + 1;
      uVar7 = ((long)local_a0.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a0.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  if (local_88.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_88) {
    p_Var8 = local_88.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    do {
      pAVar2 = (Arg *)p_Var8[1]._M_next;
      if ((long)local_68.
                super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0011e50e:
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"val","");
        (*(code *)((_List_node_base *)pAVar2->_vptr_Arg)[4]._M_prev)
                  (&local_e0,pAVar2,(string *)local_c0);
        spacePrint(this,os,&local_e0,0x4b,3,3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0]);
        }
        Arg::getDescription_abi_cxx11_(&local_e0,(Arg *)p_Var8[1]._M_next);
        spacePrint(this,os,&local_e0,0x4b,5,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
      }
      else {
        uVar9 = ((long)local_68.
                       super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar3 = true;
        uVar7 = 0;
        do {
          for (ppAVar10 = local_68.
                          super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              ppAVar10 !=
              local_68.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7].
              super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppAVar10 = ppAVar10 + 1) {
            if (*ppAVar10 == pAVar2) goto LAB_0011e504;
          }
          uVar7 = uVar7 + 1;
          bVar3 = uVar7 <= uVar9 && uVar9 - uVar7 != 0;
        } while (uVar7 != uVar9 + (uVar9 == 0));
LAB_0011e504:
        if (!bVar3) goto LAB_0011e50e;
      }
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)&local_88);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  spacePrint(this,os,&local_50,0x4b,3,0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_a0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  while (local_88.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_88) {
    p_Var8 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
              &(local_88.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_88.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                    _M_node.super__List_node_base._M_next);
    local_88.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var8;
  }
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}